

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void __thiscall CSocekt::clearMsgSendQueue(CSocekt *this)

{
  bool bVar1;
  CMemory *in_RDI;
  CMemory *p_memory;
  char *sTmpMempoint;
  void *in_stack_ffffffffffffffd8;
  
  CMemory::GetInstance();
  while( true ) {
    bVar1 = std::__cxx11::list<char_*,_std::allocator<char_*>_>::empty
                      ((list<char_*,_std::allocator<char_*>_> *)(in_RDI + 0x1948));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::__cxx11::list<char_*,_std::allocator<char_*>_>::front
              ((list<char_*,_std::allocator<char_*>_> *)in_RDI);
    std::__cxx11::list<char_*,_std::allocator<char_*>_>::pop_front
              ((list<char_*,_std::allocator<char_*>_> *)in_RDI);
    CMemory::FreeMemory(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void CSocekt::clearMsgSendQueue()
{
	char * sTmpMempoint;
	CMemory *p_memory = CMemory::GetInstance();
	
	while(!m_MsgSendQueue.empty())
	{
		sTmpMempoint = m_MsgSendQueue.front();
		m_MsgSendQueue.pop_front(); 
		p_memory->FreeMemory(sTmpMempoint);
	}	
}